

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O0

void * lyplg_type_print_date_and_time
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  void *__src;
  anon_union_24_16_e2776397_for_lyd_value_2 *paVar1;
  int iVar2;
  LY_ERR LVar3;
  size_t sVar4;
  tm *ptVar5;
  char *pcVar6;
  char *local_d8;
  size_t local_a0;
  size_t local_98;
  ly_ctx *local_90;
  char *ret;
  tm tm;
  lyd_value_date_and_time *val;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *ctx_local;
  
  tm.tm_zone = (char *)&value->field_2;
  if (format == LY_VALUE_LYB) {
    if (((value->field_2).fixed_mem[0x10] == '\0') && (*(long *)((long)&value->field_2 + 8) == 0)) {
      *dynamic = '\0';
      local_90 = (ly_ctx *)tm.tm_zone;
      if (value_len != (size_t *)0x0) {
        *value_len = 8;
      }
    }
    else {
      if (*(long *)((long)&value->field_2 + 8) == 0) {
        local_98 = 0;
      }
      else {
        local_98 = strlen(*(char **)((long)&value->field_2 + 8));
      }
      local_90 = (ly_ctx *)malloc(local_98 + 9);
      if (local_90 == (ly_ctx *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyplg_type_print_date_and_time");
        return (void *)0x0;
      }
      *dynamic = '\x01';
      if (value_len != (size_t *)0x0) {
        if (*(long *)(tm.tm_zone + 8) == 0) {
          local_a0 = 0;
        }
        else {
          local_a0 = strlen(*(char **)(tm.tm_zone + 8));
        }
        *value_len = local_a0 + 9;
      }
      ((anon_union_24_16_e2776397_for_lyd_value_2 *)&local_90->dict)->dec64 = *(int64_t *)tm.tm_zone
      ;
      ((anon_union_24_16_e2776397_for_lyd_value_2 *)&local_90->dict)->fixed_mem[8] =
           tm.tm_zone[0x10];
      if (*(long *)(tm.tm_zone + 8) != 0) {
        paVar1 = (anon_union_24_16_e2776397_for_lyd_value_2 *)&local_90->dict;
        __src = *(void **)(tm.tm_zone + 8);
        sVar4 = strlen(*(char **)(tm.tm_zone + 8));
        memcpy((void *)((long)paVar1 + 9),__src,sVar4);
      }
    }
    return local_90;
  }
  if (value->_canonical == (char *)0x0) {
    if ((value->field_2).fixed_mem[0x10] == '\0') {
      LVar3 = ly_time_time2str(*(time_t *)tm.tm_zone,*(char **)((long)&value->field_2 + 8),
                               (char **)&local_90);
      if (LVar3 != LY_SUCCESS) {
        return (void *)0x0;
      }
    }
    else {
      ptVar5 = gmtime_r((time_t *)tm.tm_zone,(tm *)&ret);
      if (ptVar5 == (tm *)0x0) {
        return (void *)0x0;
      }
      pcVar6 = "";
      if (*(long *)(tm.tm_zone + 8) != 0) {
        pcVar6 = ".";
      }
      if (*(long *)(tm.tm_zone + 8) == 0) {
        local_d8 = "";
      }
      else {
        local_d8 = *(char **)(tm.tm_zone + 8);
      }
      iVar2 = asprintf((char **)&local_90,"%04d-%02d-%02dT%02d:%02d:%02d%s%s-00:00",
                       (ulong)(tm.tm_mday + 0x76c),(ulong)(tm.tm_hour + 1),(ulong)(uint)tm.tm_min,
                       (ulong)(uint)tm.tm_sec,ret._4_4_,ret._0_4_,pcVar6,local_d8);
      if (iVar2 == -1) {
        return (void *)0x0;
      }
    }
    LVar3 = lydict_insert_zc(ctx,(char *)local_90,&value->_canonical);
    if (LVar3 != LY_SUCCESS) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyplg_type_print_date_and_time");
      return (void *)0x0;
    }
  }
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  if (value_len != (size_t *)0x0) {
    sVar4 = strlen(value->_canonical);
    *value_len = sVar4;
  }
  return value->_canonical;
}

Assistant:

static const void *
lyplg_type_print_date_and_time(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lyd_value_date_and_time *val;
    struct tm tm;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        if (val->unknown_tz || val->fractions_s) {
            ret = malloc(8 + 1 + (val->fractions_s ? strlen(val->fractions_s) : 0));
            LY_CHECK_ERR_RET(!ret, LOGMEM(ctx), NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = 8 + 1 + (val->fractions_s ? strlen(val->fractions_s) : 0);
            }
            memcpy(ret, &val->time, sizeof val->time);
            memcpy(ret + 8, &val->unknown_tz, sizeof val->unknown_tz);
            if (val->fractions_s) {
                memcpy(ret + 9, val->fractions_s, strlen(val->fractions_s));
            }
        } else {
            *dynamic = 0;
            if (value_len) {
                *value_len = 8;
            }
            ret = (char *)&val->time;
        }
        return ret;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        if (val->unknown_tz) {
            /* ly_time_time2str but always using GMT */
            if (!gmtime_r(&val->time, &tm)) {
                return NULL;
            }
            if (asprintf(&ret, "%04d-%02d-%02dT%02d:%02d:%02d%s%s-00:00",
                    tm.tm_year + 1900, tm.tm_mon + 1, tm.tm_mday, tm.tm_hour, tm.tm_min, tm.tm_sec,
                    val->fractions_s ? "." : "", val->fractions_s ? val->fractions_s : "") == -1) {
                return NULL;
            }
        } else {
            if (ly_time_time2str(val->time, val->fractions_s, &ret)) {
                return NULL;
            }
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}